

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O2

int find_symbol(Grammar *g,char *s,char *e,int kind)

{
  byte bVar1;
  Term *pTVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  Production *pPVar6;
  ulong uVar7;
  char *__s;
  uint uVar8;
  char *pcVar9;
  int local_44;
  
  pcVar9 = s;
  while ((bVar1 = *s, (ulong)bVar1 != 0 &&
         (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x20) != 0)
         )) {
    s = (char *)((byte *)s + 1);
    pcVar9 = pcVar9 + 1;
  }
  uVar8 = 0xffffffff;
  if (s < e) {
    if (kind == 1) {
      pPVar6 = lookup_production(g,s,(int)e - (int)pcVar9);
      if (pPVar6 != (Production *)0x0) {
        uVar8 = pPVar6->index;
      }
    }
    else if (kind == 4) {
      local_44 = -1;
      for (uVar7 = 0; uVar7 < (g->terminals).n; uVar7 = uVar7 + 1) {
        pTVar2 = (g->terminals).v[uVar7];
        if (pTVar2->kind == TERM_STRING) {
          __s = pTVar2->term_name;
          if (__s == (char *)0x0) {
            if (e + -(long)pTVar2->string_len == pcVar9) {
              __s = pTVar2->string;
              goto LAB_00137089;
            }
          }
          else {
            sVar5 = strlen(__s);
            if (e + -sVar5 == pcVar9) {
LAB_00137089:
              iVar3 = strncmp(s,__s,(long)e - (long)pcVar9);
              if (iVar3 == 0) {
                if (local_44 < 1) {
                  local_44 = (int)uVar7;
                }
                else {
                  d_fail("attempt to find symbol for non-unique string \'%s\'\n",pTVar2->string);
                }
              }
            }
          }
        }
      }
      if (local_44 < 1) {
        uVar8 = 0xffffffff;
      }
      else {
        uVar8 = local_44 + (g->productions).n;
      }
    }
  }
  return uVar8;
}

Assistant:

static int find_symbol(Grammar *g, char *s, char *e, int kind) {
  while (*s && isspace_(*s)) s++;
  if (e > s) {
    if (kind == D_SYMBOL_NTERM) {
      Production *p;
      if ((p = lookup_production(g, s, e - s))) return p->index;
    } else if (kind == D_SYMBOL_STRING) {
      uint i;
      int found = -1;
      for (i = 0; i < g->terminals.n; i++)
        if (g->terminals.v[i]->kind == TERM_STRING &&
            ((g->terminals.v[i]->term_name && strlen(g->terminals.v[i]->term_name) == (size_t)(e - s) &&
              !strncmp(s, g->terminals.v[i]->term_name, e - s)) ||
             (!g->terminals.v[i]->term_name && g->terminals.v[i]->string_len == (e - s) &&
              !strncmp(s, g->terminals.v[i]->string, e - s)))) {
          if (found > 0) {
            d_fail("attempt to find symbol for non-unique string '%s'\n", g->terminals.v[i]->string);
          } else
            found = i;
        }
      if (found > 0) return found + g->productions.n;
    }
  }
  return -1;
}